

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>::
convertTo<QString>(QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>
                   *this)

{
  long lVar1;
  bool bVar2;
  DataPointer *this_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>
  *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  undefined4 in_stack_ffffffffffffffa8;
  Initialization in_stack_ffffffffffffffac;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>
  *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QString::QString((QString *)0x17dc6c);
  }
  else {
    QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>_>
    ::size(in_RDI);
    (in_RDI->a).a.a.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->a).a.a.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->a).a.a.d.size = -0x5555555555555556;
    QString::QString((QString *)this_01,(qsizetype)in_RDI,in_stack_ffffffffffffffac);
    this_00 = QString::data_ptr((QString *)in_RDI);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1StringView>,_QString>,_char16_t>_>
    ::appendTo<QChar>(in_RDI,(QChar **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                     );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)this_01;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }